

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

value_and_holder * __thiscall
pybind11::detail::instance::get_value_and_holder
          (value_and_holder *__return_storage_ptr__,instance *this,type_info *find_type,
          bool throw_if_missing)

{
  PyTypeObject *type;
  PyTypeObject *type_00;
  PyTypeObject *type_01;
  anon_union_24_2_63b86169_for_instance_1 *paVar1;
  iterator it;
  values_and_holders vhs;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  iterator local_70;
  values_and_holders local_40;
  
  if ((find_type == (type_info *)0x0) || (type = (this->ob_base).ob_type, type == find_type->type))
  {
    __return_storage_ptr__->inst = this;
    __return_storage_ptr__->index = 0;
    __return_storage_ptr__->type = find_type;
    if ((this->field_0x30 & 2) == 0) {
      paVar1 = (anon_union_24_2_63b86169_for_instance_1 *)(this->field_1).simple_value_holder[0];
    }
    else {
      paVar1 = &this->field_1;
    }
    __return_storage_ptr__->vh = (void **)paVar1;
  }
  else {
    local_40.inst = this;
    local_40.tinfo = all_type_info(type);
    values_and_holders::find(&local_70,&local_40,find_type);
    if (CONCAT44(local_70.curr.index._4_4_,(undefined4)local_70.curr.index) ==
        (long)((local_40.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)((local_40.tinfo)->
              super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              )._M_impl.super__Vector_impl_data._M_start >> 3) {
      if (throw_if_missing) {
        get_fully_qualified_tp_name_abi_cxx11_(&local_90,(detail *)find_type->type,type_00);
        std::operator+(&local_110,"pybind11::detail::instance::get_value_and_holder: `",&local_90);
        std::operator+(&local_f0,&local_110,"\' is not a pybind11 base of the given `");
        get_fully_qualified_tp_name_abi_cxx11_(&local_130,(detail *)(this->ob_base).ob_type,type_01)
        ;
        std::operator+(&local_d0,&local_f0,&local_130);
        std::operator+(&local_b0,&local_d0,"\' instance");
        pybind11_fail(&local_b0);
      }
      local_70.curr.inst._0_4_ = 0;
      local_70.curr.inst._4_4_ = 0;
      local_70.curr.index._0_4_ = 0;
      local_70.curr.index._4_4_ = 0;
      __return_storage_ptr__->type = (type_info *)0x0;
      __return_storage_ptr__->vh = (void **)0x0;
    }
    else {
      __return_storage_ptr__->type = local_70.curr.type;
      __return_storage_ptr__->vh = local_70.curr.vh;
    }
    *(undefined4 *)&__return_storage_ptr__->inst = local_70.curr.inst._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->inst + 4) = local_70.curr.inst._4_4_;
    *(undefined4 *)&__return_storage_ptr__->index = (undefined4)local_70.curr.index;
    *(undefined4 *)((long)&__return_storage_ptr__->index + 4) = local_70.curr.index._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

PYBIND11_NOINLINE value_and_holder
instance::get_value_and_holder(const type_info *find_type /*= nullptr default in common.h*/,
                               bool throw_if_missing /*= true in common.h*/) {
    // Optimize common case:
    if (!find_type || Py_TYPE(this) == find_type->type) {
        return value_and_holder(this, find_type, 0, 0);
    }

    detail::values_and_holders vhs(this);
    auto it = vhs.find(find_type);
    if (it != vhs.end()) {
        return *it;
    }

    if (!throw_if_missing) {
        return value_and_holder();
    }

#if defined(NDEBUG)
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: "
                  "type is not a pybind11 base of the given instance "
                  "(compile in debug mode for type details)");
#else
    pybind11_fail("pybind11::detail::instance::get_value_and_holder: `"
                  + get_fully_qualified_tp_name(find_type->type)
                  + "' is not a pybind11 base of the given `"
                  + get_fully_qualified_tp_name(Py_TYPE(this)) + "' instance");
#endif
}